

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerInvalidRate_Test::TestBody
          (Sampler_testProbabilisticSamplerInvalidRate_Test *this)

{
  bool bVar1;
  byte bVar2;
  Metrics *pMVar3;
  AssertHelper local_240 [8];
  Message local_238 [16];
  invalid_argument *anon_var_0_1;
  Logger local_220 [4];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [7];
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_1e0 [16];
  invalid_argument *anon_var_0;
  Logger local_1c8 [4];
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [7];
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  metrics;
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  logger;
  allocator local_171;
  string local_170;
  allocator local_149;
  string local_148;
  undefined1 local_128 [8];
  Config samplerConfig2;
  allocator local_c1;
  string local_c0;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  Config samplerConfig1;
  Sampler_testProbabilisticSamplerInvalidRate_Test *this_local;
  
  samplerConfig1._samplingRefreshInterval.__r = (rep)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"probabilistic",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"",&local_c1);
  samplerConfig2._samplingRefreshInterval.__r = 0;
  Config::Config((Config *)local_68,&local_88,1.1,&local_c0,0,
                 &samplerConfig2._samplingRefreshInterval);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"probabilistic",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",&local_171);
  logger._M_t.
  super___uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::logging::Logger_*,_std::default_delete<jaegertracing::logging::Logger>_>
  .super__Head_base<0UL,_jaegertracing::logging::Logger_*,_false>._M_head_impl =
       (__uniq_ptr_data<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>,_true,_true>
        )(__uniq_ptr_impl<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
          )0x0;
  Config::Config((Config *)local_128,&local_148,-0.1,&local_170,0,(duration *)&logger);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  jaegertracing::logging::nullLogger();
  jaegertracing::metrics::Metrics::makeNullMetrics();
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)auStack_198,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool((ConstCharPtr *)auStack_198);
  if (bVar1) {
    local_1a8[0xf] = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1c8,"test-service",(allocator *)((long)&anon_var_0 + 7));
      pMVar3 = (Metrics *)
               std::
               unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
               ::operator*((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                            *)&metrics);
      std::
      unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
      ::operator*((unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                   *)&gtest_msg);
      Config::makeSampler((Config *)local_1a8,(string *)local_68,local_1c8,pMVar3);
      std::
      unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
      ::~unique_ptr((unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                     *)local_1a8);
      std::__cxx11::string::~string((string *)local_1c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
    }
    if ((local_1a8[0xf] & 1) != 0) {
      testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)auStack_1f0,"");
      bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool((ConstCharPtr *)auStack_1f0);
      if (bVar1) {
        local_200[0xf] = 0;
        bVar2 = testing::internal::AlwaysTrue();
        if ((bVar2 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_220,"test-service",(allocator *)((long)&anon_var_0_1 + 7));
          pMVar3 = (Metrics *)
                   std::
                   unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                   ::operator*((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
                                *)&metrics);
          std::
          unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
          ::operator*((unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                       *)&gtest_msg);
          Config::makeSampler((Config *)local_200,(string *)local_128,local_220,pMVar3);
          std::
          unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
          ::~unique_ptr((unique_ptr<jaegertracing::samplers::Sampler,_std::default_delete<jaegertracing::samplers::Sampler>_>
                         *)local_200);
          std::__cxx11::string::~string((string *)local_220);
          std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0_1 + 7));
        }
        if ((local_200[0xf] & 1) != 0) {
          anon_var_0._0_4_ = 0;
          goto LAB_003012e2;
        }
        _auStack_1f0 = 
        "Expected: samplerConfig2.makeSampler(\"test-service\", *logger, *metrics) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
        ;
      }
      testing::Message::Message(local_238);
      testing::internal::AssertHelper::AssertHelper
                (local_240,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0xae,_auStack_1f0);
      testing::internal::AssertHelper::operator=(local_240,local_238);
      testing::internal::AssertHelper::~AssertHelper(local_240);
      testing::Message::~Message(local_238);
      anon_var_0._0_4_ = 1;
      goto LAB_003012e2;
    }
    _auStack_198 = 
    "Expected: samplerConfig1.makeSampler(\"test-service\", *logger, *metrics) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_1e0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_msg_1,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
             ,0xac,_auStack_198);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_1e0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
  testing::Message::~Message(local_1e0);
  anon_var_0._0_4_ = 1;
LAB_003012e2:
  std::
  unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
  ::~unique_ptr((unique_ptr<jaegertracing::metrics::Metrics,_std::default_delete<jaegertracing::metrics::Metrics>_>
                 *)&gtest_msg);
  std::
  unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>::
  ~unique_ptr((unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
               *)&metrics);
  Config::~Config((Config *)local_128);
  Config::~Config((Config *)local_68);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerInvalidRate)
{
    Config samplerConfig1(kSamplerTypeProbabilistic,
                          1.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    Config samplerConfig2(kSamplerTypeProbabilistic,
                          -0.1,
                          "",
                          0,
                          samplers::Config::Clock::duration());
    auto logger = logging::nullLogger();
    auto metrics = metrics::Metrics::makeNullMetrics();
    ASSERT_THROW(samplerConfig1.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
    ASSERT_THROW(samplerConfig2.makeSampler("test-service", *logger, *metrics),
                 std::invalid_argument);
}